

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureAllocationTestCase::positiveTesting
          (SparseTextureAllocationTestCase *this,Functions *gl,GLint target,GLint format)

{
  bool bVar1;
  GLint GVar2;
  GLenum GVar3;
  int local_38;
  GLint depth;
  GLint pageSizeZ;
  GLint pageSizeY;
  GLint pageSizeX;
  GLuint texture;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureAllocationTestCase *this_local;
  
  pageSizeX = format;
  texture = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  std::operator<<((ostream *)&this->field_0x88,"Positive Testing - ");
  gl4cts::Texture::Generate(_format_local,(GLuint *)&pageSizeY);
  gl4cts::Texture::Bind(_format_local,pageSizeY,texture);
  GVar2 = SparseTextureUtils::getTargetDepth(texture);
  SparseTextureUtils::getTexturePageSizes
            (_format_local,texture,pageSizeX,&pageSizeZ,&depth,&local_38);
  (*_format_local->texParameteri)(texture,0x91a6,1);
  GVar3 = (*_format_local->getError)();
  bVar1 = SparseTextureUtils::verifyError(&this->mLog,"texParameteri",GVar3,0);
  if (bVar1) {
    if ((texture == 0x8513) || (texture == 0x9009)) {
      if (depth < pageSizeZ) {
        depth = pageSizeZ;
      }
      else if (pageSizeZ < depth) {
        pageSizeZ = depth;
      }
    }
    gl4cts::Texture::Storage(_format_local,texture,1,pageSizeX,pageSizeZ,depth,GVar2 * local_38);
    GVar3 = (*_format_local->getError)();
    bVar1 = SparseTextureUtils::verifyError(&this->mLog,"Texture::Storage",GVar3,0);
    if (bVar1) {
      gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
      this_local._7_1_ = true;
    }
    else {
      gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
      this_local._7_1_ = false;
    }
  }
  else {
    gl4cts::Texture::Delete(_format_local,(GLuint *)&pageSizeY);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SparseTextureAllocationTestCase::positiveTesting(const Functions& gl, GLint target, GLint format)
{
	mLog << "Positive Testing - ";

	GLuint texture;

	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	GLint pageSizeX;
	GLint pageSizeY;
	GLint pageSizeZ;
	GLint depth = SparseTextureUtils::getTargetDepth(target);
	SparseTextureUtils::getTexturePageSizes(gl, target, format, pageSizeX, pageSizeY, pageSizeZ);

	gl.texParameteri(target, GL_TEXTURE_SPARSE_ARB, GL_TRUE);
	if (!SparseTextureUtils::verifyError(mLog, "texParameteri", gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	//The <width> and <height> has to be equal for cube map textures
	if (target == GL_TEXTURE_CUBE_MAP || target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		if (pageSizeX > pageSizeY)
			pageSizeY = pageSizeX;
		else if (pageSizeX < pageSizeY)
			pageSizeX = pageSizeY;
	}

	Texture::Storage(gl, target, 1, format, pageSizeX, pageSizeY, depth * pageSizeZ);
	if (!SparseTextureUtils::verifyError(mLog, "Texture::Storage", gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	Texture::Delete(gl, texture);
	return true;
}